

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::SeekHead::MaxEntrySize(SeekHead *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  
  uVar1 = EbmlElementSize(0x53ab,0xffffffff);
  uVar2 = EbmlElementSize(0x53ac,0xffffffffffffffff);
  uVar3 = EbmlMasterElementSize(0x4dbb,uVar2 + uVar1);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint64_t SeekHead::MaxEntrySize() const {
  const uint64_t max_entry_payload_size =
      EbmlElementSize(libwebm::kMkvSeekID,
                      static_cast<uint64>(UINT64_C(0xffffffff))) +
      EbmlElementSize(libwebm::kMkvSeekPosition,
                      static_cast<uint64>(UINT64_C(0xffffffffffffffff)));
  const uint64_t max_entry_size =
      EbmlMasterElementSize(libwebm::kMkvSeek, max_entry_payload_size) +
      max_entry_payload_size;

  return max_entry_size;
}